

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall google::protobuf::DescriptorPool::Tables::Tables(Tables *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  WellKnownType local_2f0 [16];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_2b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_288;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_238;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_210;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_1e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_1c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_198;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  local_58;
  
  (this->pending_files_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pending_files_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pending_files_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->known_bad_files_)._M_h._M_buckets = &(this->known_bad_files_)._M_h._M_single_bucket;
  (this->known_bad_files_)._M_h._M_bucket_count = 1;
  (this->known_bad_files_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->known_bad_files_)._M_h._M_element_count = 0;
  (this->known_bad_files_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->known_bad_files_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->known_bad_files_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->known_bad_symbols_)._M_h._M_buckets = &(this->known_bad_symbols_)._M_h._M_single_bucket;
  (this->known_bad_symbols_)._M_h._M_bucket_count = 1;
  (this->known_bad_symbols_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->known_bad_symbols_)._M_h._M_element_count = 0;
  (this->known_bad_symbols_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->known_bad_symbols_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->known_bad_symbols_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->extensions_loaded_from_db_)._M_h._M_buckets =
       &(this->extensions_loaded_from_db_)._M_h._M_single_bucket;
  (this->extensions_loaded_from_db_)._M_h._M_bucket_count = 1;
  (this->extensions_loaded_from_db_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->extensions_loaded_from_db_)._M_h._M_element_count = 0;
  (this->extensions_loaded_from_db_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->extensions_loaded_from_db_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->extensions_loaded_from_db_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->well_known_types_)._M_h._M_buckets = &(this->well_known_types_)._M_h._M_single_bucket;
  (this->well_known_types_)._M_h._M_bucket_count = 1;
  (this->well_known_types_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->well_known_types_)._M_h._M_element_count = 0;
  (this->well_known_types_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->arena_).rollback_info_.
  super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->arena_).rollback_info_.
  super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->arena_).num_allocations_ = 0;
  (this->arena_).rollback_info_.
  super__Vector_base<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo,_std::allocator<google::protobuf::(anonymous_namespace)::TableArena::RollbackInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arena_).small_size_blocks_._M_elems[5] = (Block *)0x0;
  (this->arena_).full_blocks_ = (Block *)0x0;
  (this->arena_).small_size_blocks_._M_elems[3] = (Block *)0x0;
  (this->arena_).small_size_blocks_._M_elems[4] = (Block *)0x0;
  (this->arena_).small_size_blocks_._M_elems[1] = (Block *)0x0;
  (this->arena_).small_size_blocks_._M_elems[2] = (Block *)0x0;
  (this->arena_).current_ = (Block *)0x0;
  (this->arena_).small_size_blocks_._M_elems[0] = (Block *)0x0;
  (this->well_known_types_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->well_known_types_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->symbols_by_name_)._M_h._M_buckets = &(this->symbols_by_name_)._M_h._M_single_bucket;
  (this->symbols_by_name_)._M_h._M_bucket_count = 1;
  (this->symbols_by_name_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->symbols_by_name_)._M_h._M_element_count = 0;
  (this->symbols_by_name_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->symbols_by_name_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->symbols_by_name_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->files_by_name_)._M_h._M_buckets = &(this->files_by_name_)._M_h._M_single_bucket;
  (this->files_by_name_)._M_h._M_bucket_count = 1;
  (this->files_by_name_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->files_by_name_)._M_h._M_element_count = 0;
  (this->files_by_name_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->files_by_name_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->files_by_name_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
  (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->extensions_after_checkpoint_).
  super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->extensions_after_checkpoint_).
  super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->files_after_checkpoint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->files_after_checkpoint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->symbols_after_checkpoint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->files_after_checkpoint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->symbols_after_checkpoint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->symbols_after_checkpoint_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->extensions_after_checkpoint_).
  super__Vector_base<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->checkpoints_).
  super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->checkpoints_).
  super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->checkpoints_).
  super__Vector_base<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f0[0xf] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[28],_google::protobuf::Descriptor::WellKnownType,_true>
            (&local_2b0,(char (*) [28])"google.protobuf.DoubleValue",local_2f0 + 0xf);
  local_2f0[0xe] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[27],_google::protobuf::Descriptor::WellKnownType,_true>
            (&local_288,(char (*) [27])"google.protobuf.FloatValue",local_2f0 + 0xe);
  local_2f0[0xd] = 3;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[27],_google::protobuf::Descriptor::WellKnownType,_true>
            (&local_260,(char (*) [27])"google.protobuf.Int64Value",local_2f0 + 0xd);
  local_2f0[0xc] = 4;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[28],_google::protobuf::Descriptor::WellKnownType,_true>
            (&local_238,(char (*) [28])"google.protobuf.UInt64Value",local_2f0 + 0xc);
  local_2f0[0xb] = 5;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[27],_google::protobuf::Descriptor::WellKnownType,_true>
            (&local_210,(char (*) [27])"google.protobuf.Int32Value",local_2f0 + 0xb);
  local_2f0[10] = 6;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[28],_google::protobuf::Descriptor::WellKnownType,_true>
            (&local_1e8,(char (*) [28])"google.protobuf.UInt32Value",local_2f0 + 10);
  local_2f0[9] = 7;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[28],_google::protobuf::Descriptor::WellKnownType,_true>
            (&local_1c0,(char (*) [28])"google.protobuf.StringValue",local_2f0 + 9);
  local_2f0[8] = 8;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[27],_google::protobuf::Descriptor::WellKnownType,_true>
            (&local_198,(char (*) [27])"google.protobuf.BytesValue",local_2f0 + 8);
  local_2f0[7] = 9;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[26],_google::protobuf::Descriptor::WellKnownType,_true>
            (&local_170,(char (*) [26])"google.protobuf.BoolValue",local_2f0 + 7);
  local_2f0[6] = 10;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[20],_google::protobuf::Descriptor::WellKnownType,_true>
            (&local_148,(char (*) [20])"google.protobuf.Any",local_2f0 + 6);
  local_2f0[5] = 0xb;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[26],_google::protobuf::Descriptor::WellKnownType,_true>
            (&local_120,(char (*) [26])"google.protobuf.FieldMask",local_2f0 + 5);
  local_2f0[4] = 0xc;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[25],_google::protobuf::Descriptor::WellKnownType,_true>
            (&local_f8,(char (*) [25])"google.protobuf.Duration",local_2f0 + 4);
  local_2f0[3] = 0xd;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[26],_google::protobuf::Descriptor::WellKnownType,_true>
            (&local_d0,(char (*) [26])"google.protobuf.Timestamp",local_2f0 + 3);
  local_2f0[2] = 0xe;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[22],_google::protobuf::Descriptor::WellKnownType,_true>
            (&local_a8,(char (*) [22])"google.protobuf.Value",local_2f0 + 2);
  local_2f0[1] = 0xf;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[26],_google::protobuf::Descriptor::WellKnownType,_true>
            (&local_80,(char (*) [26])"google.protobuf.ListValue",local_2f0 + 1);
  local_2f0[0] = WELLKNOWNTYPE_STRUCT;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
  ::pair<const_char_(&)[23],_google::protobuf::Descriptor::WellKnownType,_true>
            (&local_58,(char (*) [23])"google.protobuf.Struct",local_2f0);
  std::__detail::
  _Insert_base<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::insert<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>const*>
            ((_Insert_base<std::__cxx11::string,std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->well_known_types_,&local_2b0,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
              *)&stack0xffffffffffffffd0);
  lVar2 = 600;
  do {
    std::__cxx11::string::~string((string *)((long)&local_2b0.first._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x28);
  return;
}

Assistant:

DescriptorPool::Tables::Tables() {
  well_known_types_.insert({
      {"google.protobuf.DoubleValue", Descriptor::WELLKNOWNTYPE_DOUBLEVALUE},
      {"google.protobuf.FloatValue", Descriptor::WELLKNOWNTYPE_FLOATVALUE},
      {"google.protobuf.Int64Value", Descriptor::WELLKNOWNTYPE_INT64VALUE},
      {"google.protobuf.UInt64Value", Descriptor::WELLKNOWNTYPE_UINT64VALUE},
      {"google.protobuf.Int32Value", Descriptor::WELLKNOWNTYPE_INT32VALUE},
      {"google.protobuf.UInt32Value", Descriptor::WELLKNOWNTYPE_UINT32VALUE},
      {"google.protobuf.StringValue", Descriptor::WELLKNOWNTYPE_STRINGVALUE},
      {"google.protobuf.BytesValue", Descriptor::WELLKNOWNTYPE_BYTESVALUE},
      {"google.protobuf.BoolValue", Descriptor::WELLKNOWNTYPE_BOOLVALUE},
      {"google.protobuf.Any", Descriptor::WELLKNOWNTYPE_ANY},
      {"google.protobuf.FieldMask", Descriptor::WELLKNOWNTYPE_FIELDMASK},
      {"google.protobuf.Duration", Descriptor::WELLKNOWNTYPE_DURATION},
      {"google.protobuf.Timestamp", Descriptor::WELLKNOWNTYPE_TIMESTAMP},
      {"google.protobuf.Value", Descriptor::WELLKNOWNTYPE_VALUE},
      {"google.protobuf.ListValue", Descriptor::WELLKNOWNTYPE_LISTVALUE},
      {"google.protobuf.Struct", Descriptor::WELLKNOWNTYPE_STRUCT},
  });
}